

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  err_t eVar2;
  char *pcVar3;
  long in_RSI;
  int in_EDI;
  size_t pos;
  err_t code;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (((in_EDI < 2) ||
      (iVar1 = strCmp(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), iVar1 != 0)) &&
     (eVar2 = cmdStDo((u32)in_stack_ffffffffffffffe0), eVar2 != 0)) {
    pcVar3 = errMsg(eVar2);
    printf("bee2cmd: %s\n",pcVar3);
    return -1;
  }
  eVar2 = cmdInit();
  if (eVar2 == 0) {
    if (in_EDI < 2) {
      local_4 = cmdUsage();
    }
    else {
      for (pcVar3 = (char *)0x0; pcVar3 < _count; pcVar3 = pcVar3 + 1) {
        iVar1 = strCmp(pcVar3,in_stack_ffffffffffffffd8);
        if (iVar1 == 0) {
          iVar1 = (*_cmds[(long)pcVar3].fn)(in_EDI + -1,(char **)(in_RSI + 8));
          return iVar1;
        }
      }
      pcVar3 = errMsg(0x259);
      printf("bee2cmd: %s\n",pcVar3);
      local_4 = -1;
    }
  }
  else {
    pcVar3 = errMsg(eVar2);
    printf("bee2cmd: %s\n",pcVar3);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
	err_t code;
	size_t pos;
	// проверка штампа
	if ((argc < 2 || !strEq(argv[1], "stamp")) &&
		(code = cmdStDo(CMD_ST_BASH | CMD_ST_STAMP)) != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// старт
	code = cmdInit();
	if (code != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// справка
	if (argc < 2)
		return cmdUsage();
	// обработка команды
	for (pos = 0; pos < _count; ++pos)
		if (strEq(argv[1], _cmds[pos].name))
			return _cmds[pos].fn(argc - 1,  argv + 1);
	printf("bee2cmd: %s\n", errMsg(ERR_CMD_NOT_FOUND));
	return -1;
}